

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O1

int CfdUnblindTxOut(void *handle,char *tx_hex_string,uint32_t tx_out_index,char *blinding_key,
                   char **asset,int64_t *value,char **asset_blind_factor,char **value_blind_factor)

{
  bool bVar1;
  int64_t iVar2;
  CfdException *pCVar3;
  Amount AVar4;
  char *work_asset_blind_factor;
  char *work_asset;
  UnblindParameter unblind_data;
  ConfidentialTransactionController ctxc;
  allocator local_169;
  char *local_168;
  char *local_160;
  char *local_158;
  undefined1 local_150 [16];
  uchar local_140 [16];
  UnblindParameter local_130;
  string local_a0;
  ConfidentialTransactionController local_80;
  
  local_158 = (char *)0x0;
  local_160 = (char *)0x0;
  local_168 = (char *)0x0;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex_string);
  if (bVar1) {
    local_130.asset._vptr_ConfidentialAssetId = (_func_int **)0x5f3c92;
    local_130.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x793;
    local_130.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "CfdUnblindTxOut";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_130,kCfdLogLevelWarning,"tx is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_130.asset._vptr_ConfidentialAssetId =
         (_func_int **)
         ((long)&local_130.asset.data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_130,"Failed to parameter. tx is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_130);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(blinding_key);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_130,tx_hex_string,(allocator *)local_150);
    cfd::ConfidentialTransactionController::ConfidentialTransactionController
              (&local_80,(string *)&local_130);
    if (local_130.asset._vptr_ConfidentialAssetId !=
        (_func_int **)
        ((long)&local_130.asset.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl + 8U)) {
      operator_delete(local_130.asset._vptr_ConfidentialAssetId);
    }
    std::__cxx11::string::string((string *)&local_a0,blinding_key,&local_169);
    cfd::core::Privkey::Privkey((Privkey *)local_150,&local_a0,kMainnet,true);
    cfd::ConfidentialTransactionController::UnblindTxOut
              (&local_130,&local_80,tx_out_index,(Privkey *)local_150);
    if ((uchar *)local_150._0_8_ != (uchar *)0x0) {
      operator_delete((void *)local_150._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    bVar1 = cfd::core::ConfidentialAssetId::IsEmpty(&local_130.asset);
    if (!bVar1) {
      if (asset != (char **)0x0) {
        cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_150,&local_130.asset);
        local_158 = cfd::capi::CreateString((string *)local_150);
        if ((uchar *)local_150._0_8_ != local_140) {
          operator_delete((void *)local_150._0_8_);
        }
      }
      if (value != (int64_t *)0x0) {
        AVar4 = cfd::core::ConfidentialValue::GetAmount(&local_130.value);
        local_150._0_8_ = AVar4.amount_;
        local_150[8] = AVar4.ignore_check_;
        iVar2 = cfd::core::Amount::GetSatoshiValue((Amount *)local_150);
        *value = iVar2;
      }
      if (asset_blind_factor != (char **)0x0) {
        cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)local_150,&local_130.abf);
        local_160 = cfd::capi::CreateString((string *)local_150);
        if ((uchar *)local_150._0_8_ != local_140) {
          operator_delete((void *)local_150._0_8_);
        }
      }
      if (value_blind_factor != (char **)0x0) {
        cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)local_150,&local_130.vbf);
        local_168 = cfd::capi::CreateString((string *)local_150);
        if ((uchar *)local_150._0_8_ != local_140) {
          operator_delete((void *)local_150._0_8_);
        }
      }
    }
    if (local_158 != (char *)0x0) {
      *asset = local_158;
    }
    if (local_160 != (char *)0x0) {
      *asset_blind_factor = local_160;
    }
    if (local_168 != (char *)0x0) {
      *value_blind_factor = local_168;
    }
    local_130.value._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_007357f0;
    if (local_130.value.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_130.value.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_130.vbf._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_007354b0;
    if (local_130.vbf.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_130.vbf.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_130.abf._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_007354b0;
    if (local_130.abf.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_130.abf.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_130.asset._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_00735710;
    if ((void *)CONCAT44(local_130.asset.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         local_130.asset.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_130.asset.data_.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_130.asset.data_.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_));
    }
    local_80.super_AbstractTransactionController._vptr_AbstractTransactionController =
         (_func_int **)&PTR__ConfidentialTransactionController_00735388;
    cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&local_80.transaction_);
    return 0;
  }
  local_130.asset._vptr_ConfidentialAssetId = (_func_int **)0x5f3c92;
  local_130.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x799;
  local_130.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = "CfdUnblindTxOut";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)&local_130,kCfdLogLevelWarning,"blinding key is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_130.asset._vptr_ConfidentialAssetId =
       (_func_int **)
       ((long)&local_130.asset.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl + 8);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_130,"Failed to parameter. blinding key is null or empty.","");
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_130);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdUnblindTxOut(
    void* handle, const char* tx_hex_string, uint32_t tx_out_index,
    const char* blinding_key, char** asset, int64_t* value,
    char** asset_blind_factor, char** value_blind_factor) {
  char* work_asset = nullptr;
  char* work_asset_blind_factor = nullptr;
  char* work_value_blind_factor = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(blinding_key)) {
      warn(CFD_LOG_SOURCE, "blinding key is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. blinding key is null or empty.");
    }

    ConfidentialTransactionController ctxc(tx_hex_string);
    UnblindParameter unblind_data =
        ctxc.UnblindTxOut(tx_out_index, Privkey(blinding_key));

    if (!unblind_data.asset.IsEmpty()) {
      if (asset != nullptr) {
        work_asset = CreateString(unblind_data.asset.GetHex());
      }
      if (value != nullptr) {
        *value = unblind_data.value.GetAmount().GetSatoshiValue();
      }
      if (asset_blind_factor != nullptr) {
        work_asset_blind_factor = CreateString(unblind_data.abf.GetHex());
      }
      if (value_blind_factor != nullptr) {
        work_value_blind_factor = CreateString(unblind_data.vbf.GetHex());
      }
    }

    if (work_asset != nullptr) *asset = work_asset;
    if (work_asset_blind_factor != nullptr)
      *asset_blind_factor = work_asset_blind_factor;
    if (work_value_blind_factor != nullptr)
      *value_blind_factor = work_value_blind_factor;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    FreeBufferOnError(
        &work_asset, &work_asset_blind_factor, &work_value_blind_factor);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    FreeBufferOnError(
        &work_asset, &work_asset_blind_factor, &work_value_blind_factor);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    FreeBufferOnError(
        &work_asset, &work_asset_blind_factor, &work_value_blind_factor);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}